

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

void __thiscall
QOpenGLTexture::setSwizzleMask
          (QOpenGLTexture *this,SwizzleValue r,SwizzleValue g,SwizzleValue b,SwizzleValue a)

{
  QOpenGLTexturePrivate *this_00;
  QOpenGLTextureHelper *pQVar1;
  char cVar2;
  code *pcVar3;
  long *plVar4;
  long in_FS_OFFSET;
  SwizzleValue local_48;
  SwizzleValue SStack_44;
  SwizzleValue SStack_40;
  SwizzleValue SStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::currentContext();
  cVar2 = QOpenGLContext::isOpenGLES();
  if (cVar2 == '\0') {
    this_00 = (this->d_ptr).d;
    QOpenGLTexturePrivate::create(this_00);
    if (((this_00->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
         super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x100) == 0) {
      setSwizzleMask();
    }
    else {
      this_00->swizzleMask[0] = r;
      this_00->swizzleMask[1] = g;
      this_00->swizzleMask[2] = b;
      this_00->swizzleMask[3] = a;
      pQVar1 = this_00->texFuncs;
      pcVar3 = (code *)pQVar1->TextureParameteriv;
      plVar4 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x20);
      if (((ulong)pcVar3 & 1) != 0) {
        pcVar3 = *(code **)(pcVar3 + *plVar4 + -1);
      }
      local_48 = r;
      SStack_44 = g;
      SStack_40 = b;
      SStack_3c = a;
      (*pcVar3)(plVar4,this_00->textureId,this_00->target,this_00->bindingTarget,0x8e46,&local_48);
    }
  }
  else {
    setSwizzleMask();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexture::setSwizzleMask(SwizzleValue r, SwizzleValue g,
                                    SwizzleValue b, SwizzleValue a)
{
#if !defined(Q_OS_MAC) && !QT_CONFIG(opengles2)
    if (!QOpenGLContext::currentContext()->isOpenGLES()) {
        Q_D(QOpenGLTexture);
        d->create();
        Q_ASSERT(d->texFuncs);
        Q_ASSERT(d->textureId);
        if (!d->features.testFlag(Swizzle)) {
            qWarning("QOpenGLTexture::setSwizzleMask() requires OpenGL >= 3.3");
            return;
        }
        GLint swizzleMask[] = {GLint(r), GLint(g), GLint(b), GLint(a)};
        d->swizzleMask[0] = r;
        d->swizzleMask[1] = g;
        d->swizzleMask[2] = b;
        d->swizzleMask[3] = a;
        d->texFuncs->glTextureParameteriv(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
        return;
    }
#else
    Q_UNUSED(r);
    Q_UNUSED(g);
    Q_UNUSED(b);
    Q_UNUSED(a);
#endif
    qWarning("QOpenGLTexture: Texture swizzling is not supported");
}